

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

char * skip(char **buf,char *delimiters)

{
  char *__s;
  size_t sVar1;
  char *pcVar2;
  char *end_delimiters;
  char *end_word;
  char *begin_word;
  char *p;
  char *delimiters_local;
  char **buf_local;
  
  __s = *buf;
  sVar1 = strcspn(__s,delimiters);
  begin_word = __s + sVar1;
  sVar1 = strspn(begin_word,delimiters);
  pcVar2 = begin_word + sVar1;
  for (; begin_word < pcVar2; begin_word = begin_word + 1) {
    *begin_word = '\0';
  }
  *buf = pcVar2;
  return __s;
}

Assistant:

static char *skip(char **buf, const char *delimiters) {
  char *p, *begin_word, *end_word, *end_delimiters;

  begin_word = *buf;
  end_word = begin_word + strcspn(begin_word, delimiters);
  end_delimiters = end_word + strspn(end_word, delimiters);

  for (p = end_word; p < end_delimiters; p++) {
    *p = '\0';
  }

  *buf = end_delimiters;

  return begin_word;
}